

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *args)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<AutoFile&,TransactionSerParams>,28u,unsigned_char>(s,args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}